

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O2

void __thiscall r_exec::CSTController::reduce(CSTController *this,View *input)

{
  list<core::P<r_exec::Overlay>_> *this_00;
  atomic_int_fast64_t *paVar1;
  _Object *p_Var2;
  _func_int **pp_Var3;
  bool bVar4;
  short sVar5;
  int iVar6;
  Goal *this_01;
  _func_int **pp_Var7;
  _Fact *f_ihlp;
  undefined4 extraout_var;
  uint64_t uVar8;
  _iterator _Var9;
  const_iterator o;
  P<r_exec::Overlay> local_48;
  pthread_mutex_t *local_40;
  CSTOverlay *offspring;
  
  bVar4 = HLPController::is_orphan(&this->super_HLPController);
  if ((bVar4) ||
     (iVar6 = (*((input->super_View).object.object)->_vptr__Object[0xe])(), (char)iVar6 != '\0')) {
    return;
  }
  this_01 = _Fact::get_goal((_Fact *)(input->super_View).object.object);
  if ((this_01 != (Goal *)0x0) &&
     ((bVar4 = Goal::is_self_goal(this_01), bVar4 && (bVar4 = Goal::is_drive(this_01), !bVar4)))) {
    f_ihlp = Goal::get_target(this_01);
    (*(f_ihlp->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
      super_Code.super__Object._vptr__Object[4])(f_ihlp,0);
    sVar5 = r_code::Atom::asOpcode();
    if (sVar5 != Opcodes::ICst) {
      return;
    }
    iVar6 = (*(f_ihlp->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[9])(f_ihlp,0);
    if ((_Object *)CONCAT44(extraout_var,iVar6) !=
        (((this->super_HLPController).super_OController.super_Controller.view)->object).object) {
      return;
    }
    uVar8 = HLPController::get_requirement_count(&this->super_HLPController);
    if (uVar8 != 0) {
      return;
    }
    _Var9._cell = (int64_t)operator_new(0x40);
    HLPBindingMap::HLPBindingMap((HLPBindingMap *)_Var9._cell);
    o.super__iterator._cell = _Var9._cell;
    LOCK();
    (((atomic_int_fast64_t *)(_Var9._cell + 8))->super___atomic_base<long>)._M_i =
         (((atomic_int_fast64_t *)(_Var9._cell + 8))->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
    HLPBindingMap::init_from_f_ihlp((HLPBindingMap *)_Var9._cell,f_ihlp);
    bVar4 = HLPController::evaluate_bwd_guards
                      (&this->super_HLPController,(HLPBindingMap *)_Var9._cell);
    if (bVar4) {
      abduce(this,(HLPBindingMap *)o.super__iterator._cell,(Fact *)(input->super_View).object.object
            );
    }
    core::P<r_exec::HLPBindingMap>::~P((P<r_exec::HLPBindingMap> *)&o);
    return;
  }
  o = (const_iterator)ZEXT816(0xffffffffffffffff);
  local_40 = (pthread_mutex_t *)
             &(this->super_HLPController).super_OController.super_Controller.m_reductionMutex;
  std::mutex::lock((mutex *)&local_40->__data);
  pp_Var7 = (_func_int **)(*Now)();
  this_00 = &(this->super_HLPController).super_OController.overlays;
  _Var9._cell = (this->super_HLPController).super_OController.overlays.used_cells_head;
  o._list = this_00;
  o.super__iterator._cell = _Var9._cell;
  do {
    bVar4 = false;
LAB_00177275:
    while( true ) {
      if (_Var9._cell == -1) {
        (*(this->super_HLPController).super_OController.super_Controller.super__Object._vptr__Object
          [8])(this,(ulong)bVar4);
        pthread_mutex_unlock(local_40);
        return;
      }
      p_Var2 = ((o._list)->cells).
               super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
               ._M_impl.super__Vector_impl_data._M_start[_Var9._cell].data.object;
      pp_Var3 = p_Var2[0xb]._vptr__Object;
      if ((pp_Var3 == (_func_int **)0x0) || (pp_Var7 <= pp_Var3)) break;
      o = r_code::list<core::P<r_exec::Overlay>_>::erase(this_00,&o);
LAB_001772c3:
      _Var9._cell = o.super__iterator._cell._cell;
    }
    iVar6 = (*p_Var2->_vptr__Object[4])();
    if ((char)iVar6 != '\0') {
      o = r_code::list<core::P<r_exec::Overlay>_>::erase(this_00,&o);
      goto LAB_001772c3;
    }
    bVar4 = CSTOverlay::reduce((CSTOverlay *)
                               ((o._list)->cells).
                               super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                               ._M_impl.super__Vector_impl_data._M_start[o.super__iterator._cell].
                               data.object,input,&offspring);
    if (offspring != (CSTOverlay *)0x0) {
      local_48.object = (_Object *)offspring;
      LOCK();
      paVar1 = &(offspring->super_HLPOverlay).super_Overlay.super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
      r_code::list<core::P<r_exec::Overlay>_>::push_front(this_00,&local_48);
      core::P<r_exec::Overlay>::~P(&local_48);
      _Var9._cell = o.super__iterator._cell;
      goto LAB_00177275;
    }
    if (bVar4) {
      o = r_code::list<core::P<r_exec::Overlay>_>::erase(this_00,&o);
      _Var9 = o.super__iterator._cell;
      bVar4 = true;
      goto LAB_00177275;
    }
    _Var9._cell = ((o._list)->cells).
                  super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                  ._M_impl.super__Vector_impl_data._M_start[o.super__iterator._cell].next;
    o.super__iterator._cell = _Var9._cell;
  } while( true );
}

Assistant:

void CSTController::reduce(r_exec::View *input)
{
    if (is_orphan()) {
        return;
    }

    if (input->object->is_invalidated()) {
        return;
    }

    Goal *goal = ((_Fact *)input->object)->get_goal();

    if (goal && goal->is_self_goal() && !goal->is_drive()) { // goal is g->f->target.
        _Fact *goal_target = goal->get_target(); // handle only icst.

        if (goal_target->code(0).asOpcode() == Opcodes::ICst && goal_target->get_reference(0) == getObject()) { // f is f->icst; produce as many sub-goals as there are patterns in the cst.
            if (!get_requirement_count()) { // models will attempt to produce the icst
                P<HLPBindingMap> bm = new HLPBindingMap;
                bm->init_from_f_ihlp(goal_target);

                if (evaluate_bwd_guards(bm)) { // leaves the controller constant: no need to protect; bm may be updated.
                    abduce(bm, input->object);
                }
            }
        }
    } else {
        // std::cout<<"CTRL: "<<get_host()->get_oid()<<" > "<<input->object->get_oid()<<std::endl;
        bool match = false;
        CSTOverlay *offspring;
        r_code::list<P<Overlay> >::const_iterator o;
        std::lock_guard<std::mutex> guard(m_reductionMutex);
        uint64_t now = Now();

        for (o = overlays.begin(); o != overlays.end();) {
            if (!((CSTOverlay *)*o)->can_match(now)) {
                o = overlays.erase(o);
            } else if ((*o)->is_invalidated()) {
                o = overlays.erase(o);
            } else {
                match = ((CSTOverlay *)*o)->reduce(input, offspring);

                if (offspring) {
                    overlays.push_front(offspring);
                } else if (match) { // full match: no offspring.
                    o = overlays.erase(o);
                } else {
                    ++o;
                }
            }
        }

        check_last_match_time(match);
    }
}